

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O2

bool template_image::_CopyConstructor<long>(void)

{
  uchar colorCount_;
  uchar alignment_;
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ImageTemplate<long> image_copy;
  ImageTemplate<long> image;
  
  uVar5 = 0;
  do {
    uVar2 = Test_Helper::runCount();
    if (uVar2 <= uVar5) {
LAB_00131424:
      return uVar2 <= uVar5;
    }
    uVar3 = rand();
    uVar4 = rand();
    colorCount_ = Test_Helper::randomValue<unsigned_char>('\x01',4);
    alignment_ = Test_Helper::randomValue<unsigned_char>('\x01',0x20);
    PenguinV_Image::ImageTemplate<long>::ImageTemplate
              (&image,uVar3 & 0x3ff,uVar4 & 0x3ff,colorCount_,alignment_);
    uVar3 = rand();
    PenguinV_Image::ImageTemplate<long>::fill(&image,(ulong)(uVar3 & 0xff));
    PenguinV_Image::ImageTemplate<long>::ImageTemplate(&image_copy,&image);
    bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<long>>(&image,&image_copy);
    if (!bVar1) {
LAB_0013140c:
      PenguinV_Image::ImageTemplate<long>::~ImageTemplate(&image_copy);
      PenguinV_Image::ImageTemplate<long>::~ImageTemplate(&image);
      goto LAB_00131424;
    }
    bVar1 = Unit_Test::equalData<long>(&image,&image_copy);
    if (!bVar1) goto LAB_0013140c;
    PenguinV_Image::ImageTemplate<long>::~ImageTemplate(&image_copy);
    PenguinV_Image::ImageTemplate<long>::~ImageTemplate(&image);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool _CopyConstructor()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const uint32_t width      = Unit_Test::randomValue<uint32_t>( 1024 );
            const uint32_t height     = Unit_Test::randomValue<uint32_t>( 1024 );
            const uint8_t  colorCount = Unit_Test::randomValue<uint8_t >( 1, 4 );
            const uint8_t  alignment  = Unit_Test::randomValue<uint8_t >( 1, 32 );

            PenguinV_Image::ImageTemplate < _Type > image( width, height, colorCount, alignment );
            image.fill( static_cast<_Type>( Unit_Test::randomValue<uint8_t>( 256u ) ) );

            const PenguinV_Image::ImageTemplate < _Type > image_copy( image );

            if( !Unit_Test::equalSize( image, image_copy ) || !Unit_Test::equalData( image, image_copy ) )
                return false;
        }

        return true;
    }